

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_eh.h
# Opt level: O3

uint64_t read_value(char encoding,uchar **data)

{
  ulong uVar1;
  uint64_t uVar2;
  uint *puVar3;
  ushort *puVar4;
  ulong *puVar5;
  int bits;
  int b;
  byte local_10 [4];
  int local_c;
  
  switch(encoding & 0xf) {
  case 0:
  case 4:
  case 0xc:
    uVar1 = *(ulong *)*data;
    puVar5 = (ulong *)((long)*data + 8);
    goto LAB_00117b35;
  case 1:
    uVar2 = read_leb128(data,&local_c);
    return uVar2;
  case 2:
    puVar4 = (ushort *)*data;
    uVar1 = (ulong)*puVar4;
    break;
  case 3:
    puVar3 = (uint *)*data;
    uVar1 = (ulong)*puVar3;
    goto LAB_00117b1c;
  default:
    abort();
  case 9:
    uVar2 = read_leb128(data,(int *)local_10);
    uVar1 = 0;
    if (uVar2 >> (local_10[0] - 1 & 0x3f) == 1) {
      uVar1 = -1L << (local_10[0] & 0x3f);
    }
    return uVar1 | uVar2;
  case 10:
    puVar4 = (ushort *)*data;
    uVar1 = (ulong)(short)*puVar4;
    break;
  case 0xb:
    puVar3 = (uint *)*data;
    uVar1 = (ulong)(int)*puVar3;
LAB_00117b1c:
    puVar5 = (ulong *)(puVar3 + 1);
    goto LAB_00117b35;
  }
  puVar5 = (ulong *)(puVar4 + 1);
LAB_00117b35:
  *data = (uchar *)puVar5;
  return uVar1;
}

Assistant:

static uint64_t read_value(char encoding, unsigned char **data)
{
	enum dwarf_data_encoding type = get_encoding(encoding);
	uint64_t v;
	switch ((int)type)
	{
		// Read fixed-length types
#define READ(dwarf, type) \
		case dwarf:\
			v = (uint64_t)(*(type*)(*data));\
			*data += sizeof(type);\
			break;
		READ(DW_EH_PE_udata2, uint16_t)
		READ(DW_EH_PE_udata4, uint32_t)
		READ(DW_EH_PE_udata8, uint64_t)
		READ(DW_EH_PE_sdata2, int16_t)
		READ(DW_EH_PE_sdata4, int32_t)
		READ(DW_EH_PE_sdata8, int64_t)
		case DW_EH_PE_absptr:
			v = (uint64_t)(*(intptr_t*)(*data));
			*data += sizeof(intptr_t);
			break;
		//READ(DW_EH_PE_absptr, intptr_t)
#undef READ
		case DW_EH_PE_sleb128:
			v = read_sleb128(data);
			break;
		case DW_EH_PE_uleb128:
			v = read_uleb128(data);
			break;
		default: abort();
	}

	return v;
}